

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_joinref.cpp
# Opt level: O1

bool duckdb::HasCorrelatedColumns(Expression *expression)

{
  BoundColumnRefExpression *pBVar1;
  bool has_correlated_columns;
  undefined1 local_29;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  if (((expression->super_BaseExpression).type == BOUND_COLUMN_REF) &&
     (pBVar1 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                         (&expression->super_BaseExpression), pBVar1->depth != 0)) {
    return true;
  }
  local_28._M_unused._M_object = &local_29;
  local_29 = 0;
  local_28._8_8_ = 0;
  pcStack_10 = ::std::
               _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/tableref/plan_joinref.cpp:268:52)>
               ::_M_invoke;
  local_18 = ::std::
             _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/tableref/plan_joinref.cpp:268:52)>
             ::_M_manager;
  ExpressionIterator::EnumerateChildren
            (expression,(function<void_(duckdb::Expression_&)> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return (bool)local_29;
}

Assistant:

static bool HasCorrelatedColumns(Expression &expression) {
	if (expression.GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		auto &colref = expression.Cast<BoundColumnRefExpression>();
		if (colref.depth > 0) {
			return true;
		}
	}
	bool has_correlated_columns = false;
	ExpressionIterator::EnumerateChildren(expression, [&](Expression &child) {
		if (HasCorrelatedColumns(child)) {
			has_correlated_columns = true;
		}
	});
	return has_correlated_columns;
}